

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdcapi_key.cpp
# Opt level: O2

void __thiscall
cfdcapi_key_CombinePubkeysTest2_Test::cfdcapi_key_CombinePubkeysTest2_Test
          (cfdcapi_key_CombinePubkeysTest2_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_006516e8;
  return;
}

Assistant:

TEST(cfdcapi_key, CombinePubkeysTest2) {
  void* handle = NULL;
  int ret = CfdCreateHandle(&handle);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_FALSE((NULL == handle));

  char* output = nullptr;
  void* combine_handle = nullptr;
  ret = CfdInitializeCombinePubkey(handle, &combine_handle);
  EXPECT_EQ(kCfdSuccess, ret);
  if (ret == kCfdSuccess) {
    ret = CfdAddCombinePubkey(handle, combine_handle,
        "03662a01c232918c9deb3b330272483c3e4ec0c6b5da86df59252835afeb4ab5f9");
    EXPECT_EQ(kCfdSuccess, ret);

    ret = CfdAddCombinePubkey(handle, combine_handle,
        "0261e37f277f02a977b4f11eb5055abab4990bbf8dee701119d88df382fcc1fafe");
    EXPECT_EQ(kCfdSuccess, ret);

    ret = CfdAddCombinePubkey(handle, combine_handle,
        "022a66efd1ea9b1ad3acfcc62a5ce8c756fa6fc3917fce3d4952a8701244ed1049");
    EXPECT_EQ(kCfdSuccess, ret);

    ret = CfdAddCombinePubkey(handle, combine_handle,
        "026356a05be3fcf52a57e133b7fb1cdb52a1bf14ef43f7d053e79b2ac98d5c2dd3");
    EXPECT_EQ(kCfdSuccess, ret);

    ret = CfdFinalizeCombinePubkey(handle, combine_handle, &output);
    EXPECT_EQ(kCfdSuccess, ret);
    if (ret == kCfdSuccess) {
      EXPECT_STREQ("03a5ba2faabc8966bb1b1525f5ecbd0205b357a70d8a26446224c92fffeb1ac8ca", output);
      CfdFreeStringBuffer(output);
    }

    ret = CfdFreeCombinePubkeyHandle(handle, combine_handle);
    EXPECT_EQ(kCfdSuccess, ret);
  }

  ret = CfdGetLastErrorCode(handle);
  if (ret != kCfdSuccess) {
    char* str_buffer = NULL;
    ret = CfdGetLastErrorMessage(handle, &str_buffer);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_STREQ("", str_buffer);
    CfdFreeStringBuffer(str_buffer);
    str_buffer = NULL;
  }

  ret = CfdFreeHandle(handle);
  EXPECT_EQ(kCfdSuccess, ret);
}